

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureblitter.cpp
# Opt level: O0

QMatrix4x4 * QOpenGLTextureBlitter::targetTransform(QRectF *target,QRect *viewport)

{
  double dVar1;
  double dVar2;
  qreal qVar3;
  qreal qVar4;
  int iVar5;
  int iVar6;
  float *pfVar7;
  QRectF *in_RSI;
  QMatrix4x4 *in_RDI;
  long in_FS_OFFSET;
  QPointF QVar8;
  QMatrix4x4 *matrix;
  qreal y_translate;
  qreal x_translate;
  qreal y_scale;
  qreal x_scale;
  QPointF relative_to_viewport;
  QMatrix4x4 *this;
  QMatrix4x4 *this_00;
  QRectF *this_01;
  QMatrix4x4 *this_02;
  undefined1 local_38 [24];
  qreal local_20;
  QPointF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  this_00 = (QMatrix4x4 *)QRectF::width(in_RSI);
  iVar5 = QRect::width((QRect *)this);
  dVar1 = (double)this_00 / (double)iVar5;
  this_01 = (QRectF *)QRectF::height(in_RSI);
  iVar5 = QRect::height((QRect *)this);
  dVar2 = (double)this_01 / (double)iVar5;
  local_18.xp = -NAN;
  local_18.yp = -NAN;
  QVar8 = QRectF::topLeft(this_01);
  local_20 = QVar8.yp;
  local_38._16_8_ = QVar8.xp;
  QRect::topLeft((QRect *)this);
  this_02 = (QMatrix4x4 *)local_38;
  QPointF::QPointF((QPointF *)this_00,(QPoint *)this);
  QVar8 = ::operator-((QPointF *)this_01,(QPointF *)this_00);
  local_18.yp = QVar8.yp;
  local_18.xp = QVar8.xp;
  qVar3 = QPointF::x(&local_18);
  iVar5 = QRect::width((QRect *)this);
  qVar4 = QPointF::y(&local_18);
  iVar6 = QRect::height((QRect *)this);
  *(float *)((long)(in_RDI->m + 3) + 0) = -NAN;
  *(float *)((long)(in_RDI->m + 3) + 4) = -NAN;
  *(float *)((long)(in_RDI->m + 3) + 8) = -NAN;
  *(float *)((long)(in_RDI->m + 3) + 0xc) = -NAN;
  *(float *)((long)(in_RDI->m + 2) + 0) = -NAN;
  *(float *)((long)(in_RDI->m + 2) + 4) = -NAN;
  *(float *)((long)(in_RDI->m + 2) + 8) = -NAN;
  *(float *)((long)(in_RDI->m + 2) + 0xc) = -NAN;
  *(float *)((long)(in_RDI->m + 1) + 0) = -NAN;
  *(float *)((long)(in_RDI->m + 1) + 4) = -NAN;
  *(float *)((long)(in_RDI->m + 1) + 8) = -NAN;
  *(float *)((long)(in_RDI->m + 1) + 0xc) = -NAN;
  *(float *)((long)(in_RDI->m + 0) + 0) = -NAN;
  *(float *)((long)(in_RDI->m + 0) + 4) = -NAN;
  *(float *)((long)(in_RDI->m + 0) + 8) = -NAN;
  *(float *)((long)(in_RDI->m + 0) + 0xc) = -NAN;
  (in_RDI->flagBits).super_QFlagsStorageHelper<QMatrix4x4::Flag,_4>.
  super_QFlagsStorage<QMatrix4x4::Flag>.i = 0xaaaaaaaa;
  QMatrix4x4::QMatrix4x4(this_00);
  pfVar7 = QMatrix4x4::operator()(this_02,(int)((ulong)this_01 >> 0x20),(int)this_01);
  *pfVar7 = (float)(qVar3 / (double)iVar5 + qVar3 / (double)iVar5 + (dVar1 - 1.0));
  pfVar7 = QMatrix4x4::operator()(this_02,(int)((ulong)this_01 >> 0x20),(int)this_01);
  *pfVar7 = (float)((1.0 - dVar2) - (qVar4 / (double)iVar6 + qVar4 / (double)iVar6));
  pfVar7 = QMatrix4x4::operator()(this_02,(int)((ulong)this_01 >> 0x20),(int)this_01);
  *pfVar7 = (float)dVar1;
  pfVar7 = QMatrix4x4::operator()(this_02,(int)((ulong)this_01 >> 0x20),(int)this_01);
  *pfVar7 = (float)dVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QMatrix4x4 QOpenGLTextureBlitter::targetTransform(const QRectF &target,
                                                  const QRect &viewport)
{
    qreal x_scale = target.width() / viewport.width();
    qreal y_scale = target.height() / viewport.height();

    const QPointF relative_to_viewport = target.topLeft() - viewport.topLeft();
    qreal x_translate = x_scale - 1 + ((relative_to_viewport.x() / viewport.width()) * 2);
    qreal y_translate = -y_scale + 1 - ((relative_to_viewport.y() / viewport.height()) * 2);

    QMatrix4x4 matrix;
    matrix(0,3) = x_translate;
    matrix(1,3) = y_translate;

    matrix(0,0) = x_scale;
    matrix(1,1) = y_scale;

    return matrix;
}